

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

void tls_dtor(void *key)

{
  mg_workerTLS *tls;
  
  if ((key != (void *)0x0) && (*key == 2)) {
    *(undefined4 *)key = 0xfffffffd;
    free(key);
  }
  pthread_setspecific(sTlsKey,(void *)0x0);
  return;
}

Assistant:

static void
tls_dtor(void *key)
{
	struct mg_workerTLS *tls = (struct mg_workerTLS *)key;
	/* key == pthread_getspecific(sTlsKey); */

	if (tls) {
		if (tls->is_master == 2) {
			tls->is_master = -3; /* Mark memory as dead */
			mg_free(tls);
		}
	}
	pthread_setspecific(sTlsKey, NULL);
}